

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_interface.cpp
# Opt level: O2

bool ExrInterface::writeFrame(char *outputFile,LumaFrame *frame)

{
  Rgba *pRVar1;
  ulong uVar2;
  undefined8 uVar3;
  LumaException *this;
  ulong sizeY;
  long lVar4;
  ulong sizeX;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Array2D<Imf_2_5::Rgba> pixels;
  undefined8 local_50;
  RgbaOutputFile file;
  
  if (*(long *)(frame + 0x10) != 0) {
    sizeX = (ulong)*(uint *)frame;
    sizeY = (ulong)*(uint *)(frame + 4);
    pixels._sizeX = 0;
    pixels._sizeY = 0;
    pixels._data = (Rgba *)0x0;
    Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase(&pixels,sizeX,sizeY);
    lVar8 = 0;
    lVar6 = 0;
    for (uVar2 = 0; uVar2 != sizeX; uVar2 = uVar2 + 1) {
      lVar7 = lVar8;
      for (lVar4 = 0; pRVar1 = pixels._data, sizeY * 8 != lVar4; lVar4 = lVar4 + 8) {
        lVar5 = pixels._sizeY * lVar6;
        half::operator=((half *)((long)&((pixels._data)->r)._h + lVar5 + lVar4),
                        *(float *)(*(long *)(frame + 0x10) + lVar7));
        half::operator=((half *)((long)&(pRVar1->g)._h + lVar4 + lVar5),
                        *(float *)(lVar7 + (ulong)(uint)(*(int *)(frame + 4) * *(int *)frame) * 4 +
                                           *(long *)(frame + 0x10)));
        half::operator=((half *)((long)&(pRVar1->b)._h + lVar4 + lVar5),
                        *(float *)(lVar7 + (ulong)(uint)(*(int *)frame * *(int *)(frame + 4) * 2) *
                                           4 + *(long *)(frame + 0x10)));
        half::operator=((half *)((long)&(pRVar1->a)._h + lVar4 + lVar5),0.0);
        lVar7 = lVar7 + 4;
      }
      lVar6 = lVar6 + 8;
      lVar8 = lVar8 + sizeY * 4;
    }
    local_50 = 0;
    uVar3 = Imf_2_5::globalThreadCount();
    Imf_2_5::RgbaOutputFile::RgbaOutputFile
              ((RgbaOutputFile *)0x3f800000,0x3f800000,&file,outputFile,sizeY,sizeX,7,&local_50,0,4,
               uVar3);
    Imf_2_5::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels._data,1);
    Imf_2_5::RgbaOutputFile::writePixels((int)&file);
    Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&file);
    Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&pixels);
    return true;
  }
  this = (LumaException *)__cxa_allocate_exception(0x28);
  LumaException::LumaException(this,"Frame does not contain any data");
  __cxa_throw(this,&LumaException::typeinfo,LumaException::~LumaException);
}

Assistant:

bool ExrInterface::writeFrame(const char *outputFile, LumaFrame &frame)
{
    if (frame.buffer == NULL)
        throw LumaException("Frame does not contain any data");
    
    try
    {
        unsigned int w = frame.width, h = frame.height;
        Array2D<Rgba> pixels;
        pixels.resizeErase(h, w);
        for (size_t y=0; y<h; y++)
	        for (size_t x=0; x<w; x++)
	        {
	            Rgba &p = pixels[y][x];
	            p.r = frame.getChannel(0)[x+y*w];
	            p.g = frame.getChannel(1)[x+y*w];
	            p.b = frame.getChannel(2)[x+y*w];
	            p.a = 0;
	        }
        
        RgbaOutputFile file(outputFile, w, h, WRITE_RGB);
        file.setFrameBuffer(&pixels[0][0], 1, w);
        file.writePixels(h);
    }
    catch (const std::exception &e)
    {
        throw LumaException(e.what());
    }
    
    return 1;
}